

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

void config_array_destroy(config_array *array)

{
  config_value *value_to_destroy;
  size_t i;
  config_array *array_local;
  
  for (value_to_destroy = (config_value *)0x0; value_to_destroy < (config_value *)array->length;
      value_to_destroy = (config_value *)((long)&value_to_destroy->type + 1)) {
    if (array->values[(long)value_to_destroy] != (config_value *)0x0) {
      config_value_destroy(array->values[(long)value_to_destroy]);
    }
  }
  free(array->values);
  free(array);
  return;
}

Assistant:

void config_array_destroy(struct config_array *array)
{
        for (size_t i = 0; i < array->length; ++i) {
                struct config_value *value_to_destroy = array->values[i];

                if (value_to_destroy != NULL) {
                        config_value_destroy(value_to_destroy);
                }
        }

        free(array->values);
        free(array);
}